

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_audio_buffer_ref_get_length_in_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pLength)

{
  ma_uint64 *pLength_local;
  ma_audio_buffer_ref *pAudioBufferRef_local;
  
  if (pLength == (ma_uint64 *)0x0) {
    pAudioBufferRef_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pLength = 0;
    if (pAudioBufferRef == (ma_audio_buffer_ref *)0x0) {
      pAudioBufferRef_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      *pLength = pAudioBufferRef->sizeInFrames;
      pAudioBufferRef_local._4_4_ = MA_SUCCESS;
    }
  }
  return pAudioBufferRef_local._4_4_;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_length_in_pcm_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = pAudioBufferRef->sizeInFrames;

    return MA_SUCCESS;
}